

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O3

int ggwave_encode(ggwave_Instance id,void *payloadBuffer,int payloadSize,
                 ggwave_ProtocolId protocolId,int volume,void *waveformBuffer,int query)

{
  GGWave *this;
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  char *__format;
  void *__src;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  if (this == (GGWave *)0x0) {
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return -1;
    }
    __format = "Invalid GGWave instance %d\n";
  }
  else {
    iVar1 = GGWave::init(this,(EVP_PKEY_CTX *)(ulong)(uint)payloadSize);
    if ((char)iVar1 == '\0') {
      if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
        return -1;
      }
      __format = "Failed to initialize Tx transmission for GGWave instance %d\n";
    }
    else {
      if (query != 0) {
        if (query == 1) {
          uVar2 = GGWave::encodeSize_samples(this);
          return uVar2 * this->m_sampleSizeOut;
        }
        uVar2 = GGWave::encodeSize_samples(this);
        return uVar2;
      }
      uVar2 = GGWave::encode(this);
      if (uVar2 != 0) {
        uVar3 = this->m_sampleFormatOut - GGWAVE_SAMPLE_FORMAT_U8;
        if (uVar3 < 5) {
          __src = *(void **)((long)&this->m_sampleRateInp +
                            *(long *)(&DAT_0010c510 + (ulong)uVar3 * 8));
        }
        else {
          __src = (void *)0x0;
        }
        memcpy(waveformBuffer,__src,(long)(int)uVar2);
        return uVar2;
      }
      if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
        return -1;
      }
      __format = "Failed to encode data - GGWave instance %d\n";
    }
  }
  fprintf((anonymous_namespace)::g_fptr,__format,id);
  return -1;
}

Assistant:

int ggwave_encode(
        ggwave_Instance id,
        const void * payloadBuffer,
        int payloadSize,
        ggwave_ProtocolId protocolId,
        int volume,
        void * waveformBuffer,
        int query) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave == nullptr) {
        ggprintf("Invalid GGWave instance %d\n", id);
        return -1;
    }

    if (ggWave->init(payloadSize, (const char *) payloadBuffer, protocolId, volume) == false) {
        ggprintf("Failed to initialize Tx transmission for GGWave instance %d\n", id);
        return -1;
    }

    if (query != 0) {
        if (query == 1) {
            return ggWave->encodeSize_bytes();
        }

        return ggWave->encodeSize_samples();
    }

    const int nBytes = ggWave->encode();
    if (nBytes == 0) {
        ggprintf("Failed to encode data - GGWave instance %d\n", id);
        return -1;
    }

    {
        auto pSrc = (const char *) ggWave->txWaveform();
        auto pDst = (      char *) waveformBuffer;
        memcpy(pDst, pSrc, nBytes);
    }

    return nBytes;
}